

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_set_status(nng_http *conn,nng_http_status status,char *reason)

{
  int iVar1;
  char *pcVar2;
  
  conn->code = status;
  if (reason != (char *)0x0) {
    pcVar2 = nni_http_reason(status);
    iVar1 = strcmp(reason,pcVar2);
    if (iVar1 != 0) {
      pcVar2 = nni_strdup(reason);
      goto LAB_00137ac9;
    }
  }
  pcVar2 = (char *)0x0;
LAB_00137ac9:
  nni_strfree(conn->rsn);
  conn->rsn = pcVar2;
  return;
}

Assistant:

void
nni_http_set_status(nng_http *conn, nng_http_status status, const char *reason)
{
	conn->code = status;
	char *dup  = NULL;
	if (reason != NULL) {
		if (strcmp(reason, nni_http_reason(conn->code)) == 0) {
			dup = NULL;
		} else {
			// This might fail, but if it does, we will just
			// use the built in reason, which should not
			// fundamentally affect semantics.  This allows us to
			// make this function void, and avoid some error
			// handling.
			dup = nni_strdup(reason);
		}
	}
	nni_strfree(conn->rsn);
	conn->rsn = dup;
}